

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall
cmTarget::InsertLinkOption(cmTarget *this,string *entry,cmListFileBacktrace *bt,bool before)

{
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  const_iterator __position;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  __position._M_current =
       *(cmListFileBacktrace **)
        ((long)&(_Var1._M_head_impl)->LinkOptionsBacktraces + (ulong)!before * 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&(_Var1._M_head_impl)->LinkOptionsEntries,
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)&(_Var1._M_head_impl)->LinkOptionsEntries + (ulong)!before * 8),entry);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
            (&((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
              LinkOptionsBacktraces,__position,bt);
  return;
}

Assistant:

void cmTarget::InsertLinkOption(std::string const& entry,
                                cmListFileBacktrace const& bt, bool before)
{
  std::vector<std::string>::iterator position =
    before ? impl->LinkOptionsEntries.begin() : impl->LinkOptionsEntries.end();

  std::vector<cmListFileBacktrace>::iterator btPosition = before
    ? impl->LinkOptionsBacktraces.begin()
    : impl->LinkOptionsBacktraces.end();

  impl->LinkOptionsEntries.insert(position, entry);
  impl->LinkOptionsBacktraces.insert(btPosition, bt);
}